

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_name_gen.cxx
# Opt level: O3

int __thiscall xray_re::xr_name_gen::init(xr_name_gen *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  int in_EDX;
  
  sVar2 = strlen((char *)ctx);
  __dest = (char *)operator_new__(sVar2 + 0x10);
  this->m_name = __dest;
  memcpy(__dest,ctx,sVar2 + 1);
  this->m_offset = (uint)sVar2;
  iVar1 = -1;
  if (in_EDX == 0) {
    builtin_strncpy(__dest + (sVar2 & 0xffffffff),"0000",5);
    iVar1 = 0;
  }
  this->m_next_idx = iVar1;
  return iVar1;
}

Assistant:

void xr_name_gen::init(const char* pattern, bool mimic_gsc)
{
	size_t size = std::strlen(pattern);
	m_name = new char[size + k_reserved];
	std::memcpy(m_name, pattern, size + 1);
	m_offset = unsigned(size & UINT_MAX);
	if (mimic_gsc) {
		m_next_idx = -1;
	} else {
		m_next_idx = 0;
		std::memcpy(&m_name[m_offset], "0000", 5);
	}
}